

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdGetConfidentialTxOutCount(void *handle,char *tx_hex_string,uint32_t *count)

{
  bool bVar1;
  uint32_t uVar2;
  CfdException *this;
  allocator local_101;
  string local_100;
  ConfidentialTransactionContext tx;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_100,tx_hex_string,&local_101);
    cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&tx,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    if (count != (uint32_t *)0x0) {
      uVar2 = cfd::core::ConfidentialTransaction::GetTxOutCount(&tx.super_ConfidentialTransaction);
      *count = uVar2;
    }
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&tx);
    return 0;
  }
  tx.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)0x4fbb12;
  tx.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x34a;
  tx.super_ConfidentialTransaction.vin_.
  super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_76e360;
  cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"tx is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&tx,"Failed to parameter. tx is null or empty.",(allocator *)&local_100);
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&tx);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetConfidentialTxOutCount(
    void* handle, const char* tx_hex_string, uint32_t* count) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    ConfidentialTransactionContext tx(tx_hex_string);

    if (count != nullptr) {
      *count = tx.GetTxOutCount();
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}